

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true>::push_back
          (SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true> *this,
          pair<llvm::StringRef,_unsigned_int> *Elt)

{
  undefined8 *puVar1;
  void *pvVar2;
  size_t sVar3;
  uint uVar4;
  
  uVar4 = (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
      super_SmallVectorBase.Capacity <= uVar4) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,0x18);
    uVar4 = (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
            super_SmallVectorBase.Size;
  }
  pvVar2 = (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
           super_SmallVectorBase.BeginX;
  *(undefined8 *)((long)pvVar2 + (ulong)uVar4 * 0x18 + 0x10) = *(undefined8 *)&Elt->second;
  sVar3 = (Elt->first).Length;
  puVar1 = (undefined8 *)((long)pvVar2 + (ulong)uVar4 * 0x18);
  *puVar1 = (Elt->first).Data;
  puVar1[1] = sVar3;
  uVar4 = (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
          super_SmallVectorBase.Size;
  if (uVar4 < (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>
              ).super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
    super_SmallVectorBase.Size = uVar4 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }